

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmnutils.cpp
# Opt level: O3

int __thiscall JSONElement::operator_cast_to_int(JSONElement *this)

{
  jsmntok_t *pjVar1;
  char *pcVar2;
  JSMNUtilsEx *this_00;
  long lVar3;
  size_t __n;
  char *endptr;
  char buffer [32];
  char *local_40;
  char local_38 [40];
  
  pjVar1 = this->m_tokens;
  if ((((pjVar1 != (jsmntok_t *)0x0) && (this->m_toksize != 0)) &&
      (pcVar2 = this->m_buffer, pcVar2 != (char *)0x0)) &&
     ((pjVar1->type == JSMN_PRIMITIVE &&
      (lVar3 = (long)pjVar1->start, pcVar2[lVar3] == '-' || 0xf5 < (byte)(pcVar2[lVar3] - 0x3aU)))))
  {
    __n = pjVar1->end - lVar3;
    strncpy(local_38,pcVar2 + lVar3,__n);
    local_38[__n] = '\0';
    lVar3 = strtol(local_38,&local_40,10);
    if (*local_40 == '\0') {
      return (int)lVar3;
    }
  }
  this_00 = (JSMNUtilsEx *)__cxa_allocate_exception(0x10);
  JSMNUtilsEx::JSMNUtilsEx(this_00,&jsmn_invalid_type_ex);
  __cxa_throw(this_00,&JSMNUtilsEx::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool JSONElement::is_valid() const
{
    return m_tokens != NULL &&
        m_toksize > 0 && m_buffer != NULL;
}